

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.cpp
# Opt level: O2

int rsa_sign_wrap(mbedtls_pk_context *pk,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
                 uchar *sig,size_t sig_size,size_t *sig_len,
                 _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_rsa_context *ctx;
  int iVar1;
  size_t sVar2;
  
  iVar1 = -16000;
  if (md_alg != MBEDTLS_MD_NONE || hash_len >> 0x20 == 0) {
    ctx = (mbedtls_rsa_context *)pk->pk_ctx;
    sVar2 = mbedtls_rsa_get_len(ctx);
    *sig_len = sVar2;
    iVar1 = -0x3880;
    if (sVar2 <= sig_size) {
      iVar1 = mbedtls_rsa_pkcs1_sign(ctx,f_rng,p_rng,md_alg,(uint)hash_len,hash,sig);
    }
  }
  return iVar1;
}

Assistant:

static int rsa_sign_wrap(mbedtls_pk_context *pk, mbedtls_md_type_t md_alg,
                         const unsigned char *hash, size_t hash_len,
                         unsigned char *sig, size_t sig_size, size_t *sig_len,
                         int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    mbedtls_rsa_context *rsa = (mbedtls_rsa_context *) pk->pk_ctx;

#if SIZE_MAX > UINT_MAX
    if (md_alg == MBEDTLS_MD_NONE && UINT_MAX < hash_len) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }
#endif

    *sig_len = mbedtls_rsa_get_len(rsa);
    if (sig_size < *sig_len) {
        return MBEDTLS_ERR_PK_BUFFER_TOO_SMALL;
    }

    return mbedtls_rsa_pkcs1_sign(rsa, f_rng, p_rng,
                                  md_alg, (unsigned int) hash_len,
                                  hash, sig);
}